

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  undefined7 in_register_00000009;
  byte *pbVar10;
  uint uVar11;
  bool bVar12;
  byte *pbVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  double dVar22;
  
  *pResult = 0.0;
  uVar11 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar11 == 1) {
    lVar18 = 1;
    uVar15 = 1;
    pbVar10 = (byte *)z;
  }
  else {
    uVar19 = 3 - uVar11;
    uVar15 = 1;
    if ((int)uVar19 < length) {
      lVar18 = (long)(int)(3 - uVar11);
      do {
        pcVar1 = z + lVar18;
        if (*pcVar1 != '\0') break;
        lVar18 = lVar18 + 2;
      } while (lVar18 < length);
      uVar19 = (uint)lVar18;
      uVar15 = (uint)(*pcVar1 == '\0');
    }
    length = uVar19 ^ 1;
    pbVar10 = (byte *)(z + (uVar11 & 1));
    lVar18 = 2;
  }
  pbVar13 = (byte *)(z + length);
  while( true ) {
    if (pbVar13 <= pbVar10) {
      return 0;
    }
    bVar2 = *pbVar10;
    if ((""[bVar2] & 1) == 0) break;
    pbVar10 = pbVar10 + lVar18;
  }
  iVar8 = 0;
  lVar14 = 0;
  if ((bVar2 - 0x2b & 0xfd) == 0) {
    lVar14 = lVar18;
  }
  pbVar10 = pbVar10 + lVar14;
  if (pbVar10 < pbVar13) {
    iVar16 = 0;
    lVar14 = 0;
    do {
      if ((9 < (ulong)*pbVar10 - 0x30) || (0xcccccccccccccca < lVar14)) break;
      lVar14 = (long)(char)*pbVar10 + lVar14 * 10 + -0x30;
      pbVar10 = pbVar10 + lVar18;
      iVar16 = iVar16 + 1;
    } while (pbVar10 < pbVar13);
  }
  else {
    lVar14 = 0;
    iVar16 = 0;
  }
  iVar17 = 1;
  if (pbVar10 < pbVar13) {
    iVar8 = 0;
LAB_00155334:
    if (0xfffffffffffffff5 < (ulong)*pbVar10 - 0x3a) goto code_r0x00155345;
    iVar16 = iVar16 + iVar8;
    if (*pbVar10 == 0x2e) {
      while ((pbVar10 = pbVar10 + lVar18, pbVar10 < pbVar13 &&
             (0xfffffffffffffff5 < (ulong)*pbVar10 - 0x3a))) {
        if (lVar14 < 0xccccccccccccccb) {
          lVar14 = (long)(char)*pbVar10 + lVar14 * 10 + -0x30;
          iVar8 = iVar8 + -1;
        }
        iVar16 = iVar16 + 1;
      }
    }
    if (pbVar13 <= pbVar10) goto LAB_00155355;
    if ((*pbVar10 | 0x20) == 0x65) {
      pbVar10 = pbVar10 + lVar18;
      if (pbVar10 < pbVar13) {
        iVar17 = 1;
        if (*pbVar10 == 0x2b) {
          pbVar10 = pbVar10 + lVar18;
        }
        else if (*pbVar10 == 0x2d) {
          pbVar10 = pbVar10 + lVar18;
          iVar17 = -1;
        }
        iVar20 = 0;
        if ((pbVar10 < pbVar13) && (uVar9 = (ulong)*pbVar10, 0xfffffffffffffff5 < uVar9 - 0x3a)) {
          iVar21 = 0;
          do {
            pbVar10 = pbVar10 + lVar18;
            iVar20 = (char)uVar9 + -0x30 + iVar21 * 10;
            if (9999 < iVar21) {
              iVar20 = 10000;
            }
          } while ((pbVar10 < pbVar13) &&
                  (uVar9 = (ulong)*pbVar10, iVar21 = iVar20, 0xfffffffffffffff5 < uVar9 - 0x3a));
          bVar12 = true;
        }
        else {
          bVar12 = false;
        }
        goto LAB_001556ee;
      }
      iVar20 = 0;
      iVar17 = 1;
      bVar12 = false;
    }
    else {
      iVar20 = 0;
      iVar17 = 1;
      bVar12 = true;
LAB_001556ee:
      while ((pbVar10 < pbVar13 && ((""[*pbVar10] & 1) != 0))) {
        pbVar10 = pbVar10 + lVar18;
      }
    }
    goto LAB_0015535a;
  }
LAB_00155355:
  iVar20 = 0;
  bVar12 = true;
LAB_0015535a:
  if (lVar14 == 0) {
    if (bVar2 == 0x2d) {
      dVar22 = -0.0;
    }
    else {
      dVar22 = 0.0;
    }
  }
  else {
    uVar19 = iVar20 * iVar17 + iVar8;
    uVar11 = -uVar19;
    if (0 < (int)uVar19) {
      uVar11 = uVar19;
    }
    uVar7 = uVar11;
    if (uVar19 != 0) {
      do {
        if ((int)uVar19 < 0) {
          uVar9 = lVar14 * -0x3333333333333333 + 0x1999999999999998;
          if (0x1999999999999998 < (uVar9 >> 1 | (ulong)((uVar9 & 1) != 0) << 0x3f))
          goto LAB_001554c7;
          lVar14 = lVar14 / 10;
        }
        else {
          if (0xccccccccccccccb < lVar14) {
LAB_001554c7:
            lVar18 = -lVar14;
            if (bVar2 != 0x2d) {
              lVar18 = lVar14;
            }
            uVar11 = uVar7;
            if (uVar7 < 0x134) goto LAB_0015551c;
            if (uVar7 < 0x156) {
              fVar5 = 10.0;
              if ((uVar7 & 1) == 0) {
                fVar5 = 1.0;
              }
              if (1 < uVar7 - 0x134) {
                fVar4 = 10.0;
                fVar6 = fVar5;
                uVar11 = uVar7 - 0x134;
                do {
                  fVar4 = fVar4 * fVar4;
                  fVar5 = fVar6 * fVar4;
                  if ((uVar11 & 2) == 0) {
                    fVar5 = fVar6;
                  }
                  bVar3 = 3 < uVar11;
                  fVar6 = fVar5;
                  uVar11 = uVar11 >> 1;
                } while (bVar3);
              }
              if ((int)uVar19 < 0) {
                dVar22 = (double)((float)lVar18 / fVar5) / 1e+308;
              }
              else {
                dVar22 = (double)((float)lVar18 * fVar5) * 1e+308;
              }
            }
            else if ((int)uVar19 < 0) {
              dVar22 = (double)((ulong)(double)lVar18 & 0x8000000000000000);
            }
            else {
              dVar22 = (double)lVar18 * INFINITY;
            }
            goto LAB_0015559b;
          }
          lVar14 = lVar14 * 10;
        }
        uVar11 = uVar7 - 1;
        bVar3 = 1 < (int)uVar7;
        uVar7 = uVar11;
      } while (bVar3);
    }
    lVar18 = -lVar14;
    if (bVar2 != 0x2d) {
      lVar18 = lVar14;
    }
    if (uVar11 == 0) {
      dVar22 = (double)lVar18;
    }
    else {
LAB_0015551c:
      fVar5 = 10.0;
      if ((uVar11 & 1) == 0) {
        fVar5 = 1.0;
      }
      if (1 < uVar11) {
        fVar4 = 10.0;
        uVar9 = (ulong)uVar11;
        fVar6 = fVar5;
        do {
          fVar4 = fVar4 * fVar4;
          fVar5 = fVar6 * fVar4;
          if ((uVar9 & 2) == 0) {
            fVar5 = fVar6;
          }
          uVar11 = (uint)uVar9;
          uVar9 = uVar9 >> 1;
          fVar6 = fVar5;
        } while (3 < uVar11);
      }
      if ((int)uVar19 < 0) {
        fVar5 = (float)lVar18 / fVar5;
      }
      else {
        fVar5 = (float)lVar18 * fVar5;
      }
      dVar22 = (double)fVar5;
    }
  }
LAB_0015559b:
  if (iVar16 < 1) {
    uVar15 = 0;
  }
  *pResult = dVar22;
  if (pbVar10 != pbVar13) {
    uVar15 = 0;
  }
  if (!bVar12) {
    uVar15 = 0;
  }
  return uVar15;
code_r0x00155345:
  pbVar10 = pbVar10 + lVar18;
  iVar8 = iVar8 + 1;
  if (pbVar13 <= pbVar10) goto code_r0x0015534f;
  goto LAB_00155334;
code_r0x0015534f:
  iVar16 = iVar16 + iVar8;
  goto LAB_00155355;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd = z + length;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  i64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  double result;
  int nDigits = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */

  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    int i;
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) && s<((LARGEST_INT64-9)/10) ){
    s = s*10 + (*z - '0');
    z+=incr; nDigits++;
  }

  /* skip non-significant significand digits
  ** (increase exponent by d to shift decimal left) */
  while( z<zEnd && sqlite3Isdigit(*z) ){ z+=incr; nDigits++; d++; }
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_INT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
      }
      z+=incr; nDigits++;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;

    /* This branch is needed to avoid a (harmless) buffer overread.  The 
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;
  if( e<0 ) {
    esign = -1;
    e *= -1;
  } else {
    esign = 1;
  }

  if( s==0 ) {
    /* In the IEEE 754 standard, zero is signed. */
    result = sign<0 ? -(double)0 : (double)0;
  } else {
    /* Attempt to reduce exponent.
    **
    ** Branches that are not required for the correct answer but which only
    ** help to obtain the correct answer faster are marked with special
    ** comments, as a hint to the mutation tester.
    */
    while( e>0 ){                                       /*OPTIMIZATION-IF-TRUE*/
      if( esign>0 ){
        if( s>=(LARGEST_INT64/10) ) break;             /*OPTIMIZATION-IF-FALSE*/
        s *= 10;
      }else{
        if( s%10!=0 ) break;                           /*OPTIMIZATION-IF-FALSE*/
        s /= 10;
      }
      e--;
    }

    /* adjust the sign of significand */
    s = sign<0 ? -s : s;

    if( e==0 ){                                         /*OPTIMIZATION-IF-TRUE*/
      result = (double)s;
    }else{
      /* attempt to handle extremely small/large numbers better */
      if( e>307 ){                                      /*OPTIMIZATION-IF-TRUE*/
        if( e<342 ){                                    /*OPTIMIZATION-IF-TRUE*/
          LONGDOUBLE_TYPE scale = sqlite3Pow10(e-308);
          if( esign<0 ){
            result = s / scale;
            result /= 1.0e+308;
          }else{
            result = s * scale;
            result *= 1.0e+308;
          }
        }else{ assert( e>=342 );
          if( esign<0 ){
            result = 0.0*s;
          }else{
#ifdef INFINITY
            result = INFINITY*s;
#else
            result = 1e308*1e308*s;  /* Infinity */
#endif
          }
        }
      }else{
        LONGDOUBLE_TYPE scale = sqlite3Pow10(e);
        if( esign<0 ){
          result = s / scale;
        }else{
          result = s * scale;
        }
      }
    }
  }

  /* store the result */
  *pResult = result;

  /* return true if number and no extra non-whitespace chracters after */
  return z==zEnd && nDigits>0 && eValid && nonNum==0;
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}